

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall Catch::Clara::Opt::isMatch(Opt *this,StringRef optToken)

{
  pointer pSVar1;
  int iVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  char *__s2;
  char *__s1;
  StringRef *name;
  pointer pSVar5;
  
  uVar4 = optToken.m_size;
  __s2 = optToken.m_start;
  __n = uVar4;
  if (*__s2 == '-') {
    __s2 = __s2 + 1;
    __n = uVar4 - 1;
    if (uVar4 <= uVar4 - 1) {
      __n = uVar4;
    }
    if (uVar4 < 2) {
      __s2 = "";
      __n = 0;
    }
  }
  pSVar5 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      __s1 = pSVar5->m_start;
      uVar4 = pSVar5->m_size;
      uVar3 = uVar4;
      if (*__s1 == '-') {
        __s1 = __s1 + 1;
        uVar3 = uVar4 - 1;
        if (uVar4 <= uVar4 - 1) {
          uVar3 = uVar4;
        }
        if (uVar4 < 2) {
          __s1 = "";
          uVar3 = 0;
        }
      }
      if ((uVar3 == __n) && (iVar2 = bcmp(__s1,__s2,__n), iVar2 == 0)) {
        return true;
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  return false;
}

Assistant:

bool Opt::isMatch(StringRef optToken) const {
            auto normalisedToken = normaliseOpt(optToken);
            for (auto const& name : m_optNames) {
                if (normaliseOpt(name) == normalisedToken)
                    return true;
            }
            return false;
        }